

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O0

bool Refal2::CInternalProgramBuilder::Check(CModuleDataVector *modules,CErrorsHelper *errors)

{
  bool bVar1;
  undefined1 local_78 [8];
  CInternalProgramBuilder builder;
  bool result;
  CErrorsHelper *errors_local;
  CModuleDataVector *modules_local;
  
  builder.program.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ._7_1_ = 0;
  bVar1 = CErrorsHelper::HasErrors(errors);
  if (!bVar1) {
    bVar1 = std::
            vector<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
            ::empty(modules);
    if (!bVar1) {
      CInternalProgramBuilder((CInternalProgramBuilder *)local_78,errors);
      collect((CInternalProgramBuilder *)local_78,modules);
      bVar1 = CErrorsHelper::HasErrors(errors);
      if (!bVar1) {
        check((CInternalProgramBuilder *)local_78);
        bVar1 = CErrorsHelper::HasErrors(errors);
        builder.program.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>._M_refcount
        ._M_pi._7_1_ = (bVar1 ^ 0xffU) & 1;
      }
      ~CInternalProgramBuilder((CInternalProgramBuilder *)local_78);
    }
  }
  std::
  vector<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>,_std::allocator<std::unique_ptr<Refal2::CModuleData,_std::default_delete<Refal2::CModuleData>_>_>_>
  ::clear(modules);
  return (bool)(builder.program.super___shared_ptr<Refal2::CProgram,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._7_1_ & 1);
}

Assistant:

bool CInternalProgramBuilder::Check( CModuleDataVector& modules,
	CErrorsHelper& errors )
{
	bool result = false;
	if( !errors.HasErrors() && !modules.empty() ) {
		CInternalProgramBuilder builder( errors );
		builder.collect( modules );
		if( !errors.HasErrors() ) {
			builder.check();
			result = !errors.HasErrors();
		}
	}
	modules.clear();
	return result;
}